

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_chown(uv_loop_t *loop,uv_fs_t *req,char *path,uv_uid_t uid,uv_gid_t gid,uv_fs_cb cb)

{
  char *pcVar1;
  undefined4 in_ECX;
  uv_loop_t *in_RDX;
  uv_req_t *in_RSI;
  uv_loop_t *in_RDI;
  undefined4 in_R8D;
  uv__work *in_R9;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_4;
  
  uv__req_init(in_RDI,in_RSI,UV_FS);
  *(undefined4 *)&in_RSI[1].data = 0x18;
  in_RSI[1].active_queue[1] = (void *)0x0;
  in_RSI[2].data = (void *)0x0;
  *(uv_loop_t **)&in_RSI[1].type = in_RDI;
  *(undefined8 *)&in_RSI[2].type = 0;
  in_RSI[7].active_queue[0] = (void *)0x0;
  in_RSI[1].active_queue[0] = in_R9;
  pcVar1 = strdup((char *)in_RDX);
  *(char **)&in_RSI[2].type = pcVar1;
  if (*(long *)&in_RSI[2].type == 0) {
    local_4 = -0xc;
  }
  else {
    *(undefined4 *)&in_RSI[9].data = in_ECX;
    *(undefined4 *)((long)&in_RSI[9].data + 4) = in_R8D;
    if (in_R9 == (uv__work *)0x0) {
      uv__fs_work((uv__work *)in_RDI);
      uv__fs_done(in_R9,in_stack_ffffffffffffffcc);
      local_4 = (int)in_RSI[1].active_queue[1];
    }
    else {
      uv__work_submit(in_RDX,(uv__work *)CONCAT44(in_ECX,in_R8D),(_func_void_uv__work_ptr *)in_R9,
                      (_func_void_uv__work_ptr_int *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int uv_fs_chown(uv_loop_t* loop,
                uv_fs_t* req,
                const char* path,
                uv_uid_t uid,
                uv_gid_t gid,
                uv_fs_cb cb) {
  INIT(CHOWN);
  PATH;
  req->uid = uid;
  req->gid = gid;
  POST;
}